

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O3

string * tinyusdz::anon_unknown_160::GetExtension(string *__return_storage_ptr__,string *name)

{
  byte bVar1;
  size_type sVar2;
  pointer pcVar3;
  string *extraout_RAX;
  string *psVar4;
  size_type sVar5;
  string *result;
  byte bVar6;
  string local_30;
  
  io::GetFileExtension(&local_30,name);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_30._M_dataplus._M_p,
             local_30._M_dataplus._M_p + local_30._M_string_length);
  sVar2 = __return_storage_ptr__->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      bVar1 = pcVar3[sVar5];
      bVar6 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar6 = bVar1;
      }
      pcVar3[sVar5] = bVar6;
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
  }
  psVar4 = (string *)&local_30.field_2;
  if ((string *)local_30._M_dataplus._M_p != psVar4) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    psVar4 = extraout_RAX;
  }
  return psVar4;
}

Assistant:

std::string GetExtension(const std::string &name) {
  return to_lower(io::GetFileExtension(name));
}